

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O3

void explicit_decl(int level,Item *q)

{
  Symbol *pSVar1;
  uint uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar3;
  int iVar4;
  
  pSVar1 = (q->element).sym;
  uVar2 = pSVar1->usage;
  if (level == 0) {
    if ((uVar2 & 1) != 0) {
      diag("Multiple declaration of ",pSVar1->name);
    }
    uVar2 = uVar2 | 1;
  }
  pSVar1->usage = uVar2 | 8;
  iVar4 = (int)pSVar1->level;
  if (previous_str == (char *)0x0 && iVar4 <= level) {
    __assert_fail("previous_str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/parsact.c"
                  ,0x77,"void explicit_decl(int, Item *)");
  }
  uVar2 = (uint)pSVar1->subtype;
  if ((~uVar2 & 0x12) == 0) {
    explicit_decl_cold_3();
    uVar3 = extraout_RAX;
  }
  else if ((~uVar2 & 0x18) == 0) {
    explicit_decl_cold_2();
    uVar3 = extraout_RAX_00;
  }
  else {
    if ((~uVar2 & 10) != 0) {
      if (iVar4 <= level) {
        if (iVar4 < level) {
          (pSVar1->u).str = previous_str;
          return;
        }
        iVar4 = strcmp((pSVar1->u).str,previous_str);
        if (iVar4 == 0) {
          return;
        }
        diag(pSVar1->name," has different values at same level");
      }
      goto LAB_00110777;
    }
    explicit_decl_cold_1();
    uVar3 = extraout_RAX_01;
  }
  if ((uVar3 & 1) == 0) {
    (pSVar1->u).str = previous_str;
  }
  if (pSVar1->level <= level) {
    return;
  }
LAB_00110777:
  pSVar1->level = (short)level;
  return;
}

Assistant:

void explicit_decl(int level, Item* q)
{
	/* used to be inside parse1.y without the lastvars condition
	   Without the condition it served two purposes.
	   1) variables explicitly declared were so marked so that they
	      would appear first in the .var file.  Unmarked variables
	      appear last.
	   2) Give error message if a variable was explicitly declared
	      more than once.
	   Now, the merge program produces declaration blocks from
	   submodels with a prepended LAST_VARS keyword.  This implies
	   1) that variables in such blocks should appear last (if they
	      don't appear at the top level) and
	   2) multiple declarations are not errors.
	   Hence we merely enclose the old code in an if statement
	   The question arises, on multiple declarations, which value
	   does the .var file get.  In the current implementation it
	   is the last one seen. If this is not right (and a better
	   method would be keep the value declared closest to the root)
	   then it will be the responsibility of merge to delete
	   multiple declarations.
	*/
	/* Solving the multiple declaration problem.
	   merge now gives the level number of the declaration with
	   the root file having level number 0, all its submodels having
	   level number 1, submodels of level 1 submodels having level 2,
	   etc.  The rule is that the lowest level declaration is used.
	   If two declarations exist at the same level then it is an
	   error unless their u.str are identical.  Since, by the time
	   this routine is called the latest declaration has already been
	   installed, each installation routine saves the previous u.str
	   in a static variable. Also a new field is added to the
	   symbol structure to keep track of its level. At this time
	   we retain the EXPLICIT_DECL field for explicit declarations
	   at the root level. The default level when the symbol is
	   allocated is 100. 
	 */
	
	Symbol *sym;

	sym = SYM(q);
	if (!level) { /* No multiple declarations at the root level and
			the symbol is marked explicitly declared */
		if (sym->usage & EXPLICIT_DECL) {
			diag("Multiple declaration of ", sym->name);
		}
		sym->usage |= EXPLICIT_DECL;
	}
	/* this ensures that declared PRIMES will appear in .var file */
	sym->usage |= DEP;

	if (level >= sym->level) {
		assert(previous_str);
	}
	/* resolve possible type conflicts */
	if (type_change(sym, level)) {
		return;
	}
	/* resolve which declaration takes precedence */
	if (level < sym->level) { /* new one takes precedence */
		sym->level = level;
	}else if (level > sym->level) { /* old one takes precedence */
		sym->u.str = previous_str;
	}else if (strcmp(sym->u.str, previous_str) != 0) { /* not identical */
		diag(sym->name, " has different values at same level");
	}
}